

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

void cpu_get_tb_cpu_state_arm
               (CPUARMState *env,target_ulong *pc,target_ulong *cs_base,uint32_t *pflags)

{
  _Bool _Var1;
  uint32_t uVar2;
  int iVar3;
  ArchCPU_conflict *pAVar4;
  anon_struct_4_1_54a39816_conflict v_10;
  anon_struct_4_1_54a39816_conflict2 v_9;
  anon_struct_4_1_54a39816_conflict v_8;
  anon_struct_4_1_54a39816_conflict v_7;
  anon_struct_4_1_54a39816 v_6;
  anon_struct_4_1_54a39816_conflict1 v_5;
  anon_struct_4_1_54a39816 v_4;
  anon_struct_4_1_54a39816_conflict v_3;
  _Bool is_secure;
  anon_struct_4_1_54a39816_conflict v_2;
  anon_struct_4_1_54a39816_conflict v_1;
  anon_struct_4_1_54a39816 v;
  uint32_t pstate_for_ss;
  uint32_t flags;
  uint32_t *pflags_local;
  target_ulong *cs_base_local;
  target_ulong *pc_local;
  CPUARMState *env_local;
  
  v = (anon_struct_4_1_54a39816)env->hflags;
  *(undefined4 *)cs_base = 0;
  assert_hflags_rebuild_correctly(env);
  uVar2 = extract32((uint32_t)v,0x1f,1);
  if (uVar2 == 0) {
    *(uint32_t *)pc = env->regs[0xf];
    iVar3 = arm_feature(env,9);
    if (iVar3 == 0) {
      iVar3 = arm_feature(env,1);
      if (iVar3 == 0) {
        uVar2 = deposit32((uint32_t)v,9,3,(uint)((byte)(env->vfp).vec_len & 7));
        v = (anon_struct_4_1_54a39816)deposit32(uVar2,0xc,2,(uint)((byte)(env->vfp).vec_stride & 3))
        ;
      }
      else {
        v = (anon_struct_4_1_54a39816)
            deposit32((uint32_t)v,0xc,2,(uint)((byte)(env->cp15).c15_cpar & 3));
      }
      if (((env->vfp).xregs[8] & 0x40000000) != 0) {
        v = (anon_struct_4_1_54a39816)deposit32((uint32_t)v,0xe,1,1);
      }
    }
    else {
      iVar3 = arm_feature(env,0x25);
      if ((iVar3 != 0) && (uVar2 = extract32((env->v7m).fpccr[1],2,1), uVar2 != (env->v7m).secure))
      {
        v = (anon_struct_4_1_54a39816)deposit32((uint32_t)v,0xd,1,1);
      }
      if ((((env->v7m).fpccr[(env->v7m).secure] & 0x80000000) != 0) &&
         ((((env->v7m).control[1] & 4) == 0 ||
          (((env->v7m).secure != 0 && (((env->v7m).control[1] & 8) == 0)))))) {
        v = (anon_struct_4_1_54a39816)deposit32((uint32_t)v,0xc,1,1);
      }
      if (((env->v7m).fpccr[((env->v7m).fpccr[1] & 4) != 0] & 1) != 0) {
        v = (anon_struct_4_1_54a39816)deposit32((uint32_t)v,0xb,1,1);
      }
    }
    uVar2 = deposit32((uint32_t)v,8,1,(uint)((byte)env->thumb & 1));
    v = (anon_struct_4_1_54a39816)deposit32(uVar2,0,8,env->condexec_bits & 0xff);
    v_1 = (anon_struct_4_1_54a39816_conflict)env->uncached_cpsr;
  }
  else {
    *(int *)pc = (int)env->pc;
    pAVar4 = env_archcpu(env);
    _Var1 = isar_feature_aa64_bti(&pAVar4->isar);
    if (_Var1) {
      v = (anon_struct_4_1_54a39816)deposit32((uint32_t)v,10,2,(uint)((byte)env->btype & 3));
    }
    v_1 = (anon_struct_4_1_54a39816_conflict)env->pstate;
  }
  uVar2 = extract32((uint32_t)v,0x1e,1);
  if ((uVar2 != 0) && (((uint)v_1 & 0x200000) != 0)) {
    v = (anon_struct_4_1_54a39816)deposit32((uint32_t)v,0x1d,1,1);
  }
  *pflags = (uint32_t)v;
  return;
}

Assistant:

void cpu_get_tb_cpu_state(CPUARMState *env, target_ulong *pc,
                          target_ulong *cs_base, uint32_t *pflags)
{
    uint32_t flags = env->hflags;
    uint32_t pstate_for_ss;

    *cs_base = 0;
    assert_hflags_rebuild_correctly(env);

    if (FIELD_EX32(flags, TBFLAG_ANY, AARCH64_STATE)) {
        *pc = env->pc;
        if (cpu_isar_feature(aa64_bti, env_archcpu(env))) {
            FIELD_DP32(flags, TBFLAG_A64, BTYPE, env->btype, flags);
        }
        pstate_for_ss = env->pstate;
    } else {
        *pc = env->regs[15];

        if (arm_feature(env, ARM_FEATURE_M)) {
            if (arm_feature(env, ARM_FEATURE_M_SECURITY) &&
                FIELD_EX32(env->v7m.fpccr[M_REG_S], V7M_FPCCR, S)
                != env->v7m.secure) {
                FIELD_DP32(flags, TBFLAG_M32, FPCCR_S_WRONG, 1, flags);
            }

            if ((env->v7m.fpccr[env->v7m.secure] & R_V7M_FPCCR_ASPEN_MASK) &&
                (!(env->v7m.control[M_REG_S] & R_V7M_CONTROL_FPCA_MASK) ||
                 (env->v7m.secure &&
                  !(env->v7m.control[M_REG_S] & R_V7M_CONTROL_SFPA_MASK)))) {
                /*
                 * ASPEN is set, but FPCA/SFPA indicate that there is no
                 * active FP context; we must create a new FP context before
                 * executing any FP insn.
                 */
                FIELD_DP32(flags, TBFLAG_M32, NEW_FP_CTXT_NEEDED, 1, flags);
            }

            bool is_secure = env->v7m.fpccr[M_REG_S] & R_V7M_FPCCR_S_MASK;
            if (env->v7m.fpccr[is_secure] & R_V7M_FPCCR_LSPACT_MASK) {
                FIELD_DP32(flags, TBFLAG_M32, LSPACT, 1, flags);
            }
        } else {
            /*
             * Note that XSCALE_CPAR shares bits with VECSTRIDE.
             * Note that VECLEN+VECSTRIDE are RES0 for M-profile.
             */
            if (arm_feature(env, ARM_FEATURE_XSCALE)) {
                FIELD_DP32(flags, TBFLAG_A32,
                                   XSCALE_CPAR, env->cp15.c15_cpar, flags);
            } else {
                FIELD_DP32(flags, TBFLAG_A32, VECLEN,
                                   env->vfp.vec_len, flags);
                FIELD_DP32(flags, TBFLAG_A32, VECSTRIDE,
                                   env->vfp.vec_stride, flags);
            }
            if (env->vfp.xregs[ARM_VFP_FPEXC] & (1 << 30)) {
                FIELD_DP32(flags, TBFLAG_A32, VFPEN, 1, flags);
            }
        }

        FIELD_DP32(flags, TBFLAG_AM32, THUMB, env->thumb, flags);
        FIELD_DP32(flags, TBFLAG_AM32, CONDEXEC, env->condexec_bits, flags);
        pstate_for_ss = env->uncached_cpsr;
    }

    /*
     * The SS_ACTIVE and PSTATE_SS bits correspond to the state machine
     * states defined in the ARM ARM for software singlestep:
     *  SS_ACTIVE   PSTATE.SS   State
     *     0            x       Inactive (the TB flag for SS is always 0)
     *     1            0       Active-pending
     *     1            1       Active-not-pending
     * SS_ACTIVE is set in hflags; PSTATE_SS is computed every TB.
     */
    if (FIELD_EX32(flags, TBFLAG_ANY, SS_ACTIVE) &&
        (pstate_for_ss & PSTATE_SS)) {
        FIELD_DP32(flags, TBFLAG_ANY, PSTATE_SS, 1, flags);
    }

    *pflags = flags;
}